

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O1

void __thiscall Timidity::Renderer::adjust_pitchbend(Renderer *this,int chan)

{
  int v;
  long lVar1;
  long lVar2;
  
  v = this->voices;
  lVar2 = (long)v;
  if (lVar2 != 0) {
    lVar1 = lVar2 * 0x170 + -0x16f;
    do {
      v = v + -1;
      if (((*(byte *)((long)this->voice + lVar1 + -1) & 1) != 0) &&
         ((uint)(&this->voice->status)[lVar1] == chan)) {
        recompute_freq(this,v);
      }
      lVar2 = lVar2 + -1;
      lVar1 = lVar1 + -0x170;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

void Renderer::adjust_pitchbend(int chan)
{
	int i = voices;
	while (i--)
	{
		if ((voice[i].status & VOICE_RUNNING) && voice[i].channel == chan)
		{
			recompute_freq(i);
		}
	}
}